

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O2

size_t __thiscall
Assimp::IFC::anon_unknown_9::CompositeCurve::EstimateSampleCount
          (CompositeCurve *this,IfcFloat a,IfcFloat b)

{
  pointer ppVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  CurveEntry *entry;
  pointer ppVar5;
  double extraout_XMM0_Qa;
  double dVar6;
  double dVar7;
  IfcFloat IVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  IVar8 = b;
  bVar2 = Curve::InRange((Curve *)this,a);
  if (!bVar2) {
    __assert_fail("InRange( a )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x104,
                  "virtual size_t Assimp::IFC::(anonymous namespace)::CompositeCurve::EstimateSampleCount(IfcFloat, IfcFloat) const"
                 );
  }
  bVar2 = Curve::InRange((Curve *)this,b);
  if (!bVar2) {
    __assert_fail("InRange( b )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x105,
                  "virtual size_t Assimp::IFC::(anonymous namespace)::CompositeCurve::EstimateSampleCount(IfcFloat, IfcFloat) const"
                 );
  }
  ppVar1 = (this->curves).
           super__Vector_base<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar4 = 0;
  dVar11 = 0.0;
  for (ppVar5 = (this->curves).
                super__Vector_base<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar1; ppVar5 = ppVar5 + 1) {
    (*(((ppVar5->first).super___shared_ptr<Assimp::IFC::BoundedCurve,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_Curve)._vptr_Curve[5])();
    dVar6 = ABS(IVar8 - extraout_XMM0_Qa);
    if ((dVar11 <= b) && (a <= dVar11 + dVar6)) {
      dVar9 = a - dVar11;
      if (dVar9 <= 0.0) {
        dVar9 = 0.0;
      }
      dVar10 = b - dVar11;
      if (dVar6 <= b - dVar11) {
        dVar10 = dVar6;
      }
      if (ppVar5->second == false) {
        dVar7 = IVar8 - dVar10;
        IVar8 = IVar8 - dVar9;
      }
      else {
        dVar7 = dVar9 + extraout_XMM0_Qa;
        IVar8 = extraout_XMM0_Qa + dVar10;
      }
      iVar3 = (*(((ppVar5->first).
                  super___shared_ptr<Assimp::IFC::BoundedCurve,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->super_Curve)._vptr_Curve[6])(dVar7);
      sVar4 = sVar4 + CONCAT44(extraout_var,iVar3);
    }
    dVar11 = dVar11 + dVar6;
  }
  return sVar4;
}

Assistant:

size_t EstimateSampleCount(IfcFloat a, IfcFloat b) const {
        ai_assert( InRange( a ) );
        ai_assert( InRange( b ) );
        size_t cnt = 0;

        IfcFloat acc = 0;
        for(const CurveEntry& entry : curves) {
            const ParamRange& range = entry.first->GetParametricRange();
            const IfcFloat delta = std::abs(range.second-range.first);
            if (a <= acc+delta && b >= acc) {
                const IfcFloat at =  std::max(static_cast<IfcFloat>( 0. ),a-acc), bt = std::min(delta,b-acc);
                cnt += entry.first->EstimateSampleCount( entry.second ? at + range.first : range.second - bt, entry.second ? bt + range.first : range.second - at );
            }

            acc += delta;
        }

        return cnt;
    }